

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O0

bool pybind11::detail::npy_format_descriptor<sdf_tools::int3,_void>::direct_converter
               (PyObject *obj,void **value)

{
  bool bVar1;
  int iVar2;
  PyObject *pPVar3;
  PyObject **ppPVar4;
  undefined8 *in_RSI;
  PyObject *in_RDI;
  object descr;
  npy_api *api;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  PyObject *in_stack_ffffffffffffffb0;
  _func_bool_PyObject_ptr_PyObject_ptr *p_Var5;
  handle in_stack_ffffffffffffffb8;
  handle local_30;
  handle local_28;
  npy_api *local_20;
  undefined8 *local_18;
  PyObject *local_10;
  byte local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = npy_api::get();
  iVar2 = _PyObject_TypeCheck(in_stack_ffffffffffffffb0,
                              (PyTypeObject *)
                              CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  if (iVar2 == 0) {
    local_1 = 0;
    goto LAB_001aab7e;
  }
  pPVar3 = (*local_20->PyArray_DescrFromScalar_)(local_10);
  pybind11::handle::handle(&local_30,pPVar3);
  reinterpret_steal<pybind11::object>(in_stack_ffffffffffffffb8);
  bVar1 = pybind11::handle::operator_cast_to_bool(&local_28);
  if (bVar1) {
    p_Var5 = local_20->PyArray_EquivTypes_;
    pPVar3 = dtype_ptr();
    ppPVar4 = pybind11::handle::ptr(&local_28);
    bVar1 = (*p_Var5)(pPVar3,*ppPVar4);
    if (!bVar1) goto LAB_001aab5b;
    *local_18 = local_10[1].ob_type;
    local_1 = 1;
    bVar1 = true;
  }
  else {
LAB_001aab5b:
    bVar1 = false;
  }
  object::~object((object *)0x1aab6d);
  if (!bVar1) {
    local_1 = 0;
  }
LAB_001aab7e:
  return (bool)(local_1 & 1);
}

Assistant:

static bool direct_converter(PyObject *obj, void*& value) {
        auto& api = npy_api::get();
        if (!PyObject_TypeCheck(obj, api.PyVoidArrType_Type_))
            return false;
        if (auto descr = reinterpret_steal<object>(api.PyArray_DescrFromScalar_(obj))) {
            if (api.PyArray_EquivTypes_(dtype_ptr(), descr.ptr())) {
                value = ((PyVoidScalarObject_Proxy *) obj)->obval;
                return true;
            }
        }
        return false;
    }